

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ValuedAction __thiscall despot::POMCP::Search(POMCP *this,double timeout)

{
  Belief *pBVar1;
  State *pSVar2;
  DSPOMDP *pDVar3;
  bool bVar4;
  int iVar5;
  clock_t cVar6;
  reference ppSVar7;
  VNode *pVVar8;
  size_t sVar9;
  size_type sVar10;
  log_ostream *plVar11;
  ostream *poVar12;
  QNode *pQVar13;
  void *pvVar14;
  double dVar15;
  ValuedAction VVar16;
  int local_a8;
  int local_a4;
  ACT_TYPE action;
  int i_1;
  State *particle;
  undefined1 local_80 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  int num_sims;
  undefined1 local_58 [3];
  bool done;
  int hist_size;
  State *local_40;
  State *state;
  double start_real;
  double start_cpu;
  double timeout_local;
  POMCP *this_local;
  ValuedAction astar;
  
  start_cpu = timeout;
  timeout_local = (double)this;
  cVar6 = clock();
  start_real = (double)cVar6;
  state = (State *)get_time_second();
  if (this->root_ == (VNode *)0x0) {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(local_58,pBVar1,1);
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_58,0);
    pSVar2 = *ppSVar7;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_58);
    local_40 = pSVar2;
    pVVar8 = CreateVNode(0,pSVar2,this->prior_,(this->super_Solver).model_);
    this->root_ = pVVar8;
    pDVar3 = (this->super_Solver).model_;
    (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,local_40);
  }
  sVar9 = History::Size(&(this->super_Solver).history_);
  bVar4 = false;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  do {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(local_80,pBVar1,1000);
    for (particle._4_4_ = 0;
        sVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                           ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_80),
        (ulong)(long)particle._4_4_ < sVar10; particle._4_4_ = particle._4_4_ + 1) {
      ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_80,
                           (long)particle._4_4_);
      pSVar2 = *ppSVar7;
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 3 < iVar5)) {
        plVar11 = logging::stream(4);
        poVar12 = std::operator<<(&plVar11->super_ostream,"[POMCP::Search] Starting simulation ");
        pvVar14 = (void *)std::ostream::operator<<
                                    (poVar12,particles.
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _4_4_);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      }
      Simulate(pSVar2,this->root_,(this->super_Solver).model_,this->prior_);
      particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 3 < iVar5)) {
        plVar11 = logging::stream(4);
        poVar12 = std::operator<<(&plVar11->super_ostream,"[POMCP::Search] ");
        poVar12 = (ostream *)
                  std::ostream::operator<<
                            (poVar12,particles.
                                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        poVar12 = std::operator<<(poVar12," simulations done");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
      History::Truncate(&(this->super_Solver).history_,(int)sVar9);
      cVar6 = clock();
      if (start_cpu <= ((double)cVar6 - start_real) / 1000000.0) {
        bVar4 = true;
        break;
      }
    }
    for (action = 0;
        sVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                           ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_80),
        (ulong)(long)action < sVar10; action = action + 1) {
      pDVar3 = (this->super_Solver).model_;
      ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_80,
                           (long)action);
      (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,*ppSVar7);
    }
    if (bVar4) {
      local_a4 = 3;
    }
    else {
      local_a4 = 0;
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_80);
    if (local_a4 != 0) {
      VVar16 = OptimalAction(this->root_);
      astar._0_8_ = VVar16.value;
      this_local._0_4_ = VVar16.action;
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
        plVar11 = logging::stream(3);
        poVar12 = std::operator<<(&plVar11->super_ostream,"[POMCP::Search] Search statistics");
        poVar12 = (ostream *)
                  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        poVar12 = std::operator<<(poVar12,"OptimalAction = ");
        poVar12 = despot::operator<<(poVar12,(ValuedAction *)&this_local);
        poVar12 = (ostream *)
                  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        poVar12 = std::operator<<(poVar12,"# Simulations = ");
        iVar5 = VNode::count(this->root_);
        pvVar14 = (void *)std::ostream::operator<<(poVar12,iVar5);
        poVar12 = (ostream *)
                  std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        poVar12 = std::operator<<(poVar12,"Time: CPU / Real = ");
        cVar6 = clock();
        poVar12 = (ostream *)
                  std::ostream::operator<<(poVar12,((double)cVar6 - start_real) / 1000000.0);
        poVar12 = std::operator<<(poVar12," / ");
        dVar15 = get_time_second();
        pvVar14 = (void *)std::ostream::operator<<(poVar12,dVar15 - (double)state);
        poVar12 = (ostream *)
                  std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        poVar12 = std::operator<<(poVar12,"# active particles = ");
        iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[0x18])();
        pvVar14 = (void *)std::ostream::operator<<(poVar12,iVar5);
        poVar12 = (ostream *)
                  std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        poVar12 = std::operator<<(poVar12,"Tree size = ");
        iVar5 = VNode::Size(this->root_);
        pvVar14 = (void *)std::ostream::operator<<(poVar12,iVar5);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      }
      if ((uint)this_local == 0xffffffff) {
        for (local_a8 = 0; iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])(),
            local_a8 < iVar5; local_a8 = local_a8 + 1) {
          poVar12 = std::operator<<((ostream *)&std::cout,"action ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_a8);
          poVar12 = std::operator<<(poVar12,": ");
          pQVar13 = VNode::Child(this->root_,local_a8);
          iVar5 = QNode::count(pQVar13);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
          poVar12 = std::operator<<(poVar12," ");
          pQVar13 = VNode::Child(this->root_,local_a8);
          dVar15 = QNode::value(pQVar13);
          pvVar14 = (void *)std::ostream::operator<<(poVar12,dVar15);
          std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        }
      }
      VVar16._4_4_ = 0;
      VVar16.action = (uint)this_local;
      VVar16.value = (double)astar._0_8_;
      return VVar16;
    }
  } while( true );
}

Assistant:

ValuedAction POMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	if (root_ == NULL) {
		State* state = belief_->Sample(1)[0];
		root_ = CreateVNode(0, state, prior_, model_);
		model_->Free(state);
	}

	int hist_size = history_.Size();
	bool done = false;
	int num_sims = 0;
	while (true) {
		vector<State*> particles = belief_->Sample(1000);
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			logd << "[POMCP::Search] Starting simulation " << num_sims << endl;

			Simulate(particle, root_, model_, prior_);
 
			num_sims++;
			logd << "[POMCP::Search] " << num_sims << " simulations done" << endl;
			history_.Truncate(hist_size);

			if ((clock() - start_cpu) / CLOCKS_PER_SEC >= timeout) {
				done = true;
				break;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			model_->Free(particles[i]);
		}

		if (done)
			break;
	}

	ValuedAction astar = OptimalAction(root_);

	logi << "[POMCP::Search] Search statistics" << endl
		<< "OptimalAction = " << astar << endl 
		<< "# Simulations = " << root_->count() << endl
		<< "Time: CPU / Real = " << ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / " << (get_time_second() - start_real) << endl
		<< "# active particles = " << model_->NumActiveParticles() << endl
		<< "Tree size = " << root_->Size() << endl;

	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	// delete root_;
	return astar;
}